

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall Fl_Tree::handle(Fl_Tree *this,int e)

{
  char cVar1;
  uint uVar2;
  Fl_When FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Tree_Select FVar9;
  Fl_Tree *pFVar10;
  Fl_Widget *pFVar11;
  Fl_Tree_Item *pFVar12;
  Fl_Tree_Item *pFVar13;
  uint *__writefds;
  fd_set *__writefds_00;
  fd_set *in_R8;
  timeval *in_R9;
  bool bVar14;
  bool bVar15;
  double dVar16;
  int local_9c;
  Fl_Tree_Item *pFStack_98;
  int pos;
  Fl_Tree_Item *parent;
  bool before;
  int mid;
  int h;
  Fl_Tree_Item *item_2;
  bool visible_1;
  int val_1;
  Fl_Tree_Item *to;
  Fl_Tree_Item *from;
  Fl_Tree_Item *item_1;
  int p_1;
  int p;
  int dir;
  int my;
  bool visible;
  int val;
  Fl_Tree_Item *item;
  int itembot;
  int itemtop;
  int ekey;
  int updown;
  char is_command;
  char is_ctrl;
  char is_shift;
  int ret;
  int e_local;
  Fl_Tree *this_local;
  
  if (e == 0) {
    return 0;
  }
  updown = 0;
  uVar2 = Fl::event_state();
  bVar14 = (uVar2 & 0x10000) != 0;
  uVar2 = Fl::event_state();
  bVar15 = (uVar2 & 0x40000) != 0;
  uVar2 = Fl::event_state();
  if ((e == 3) || (e == 4)) {
    return 1;
  }
  if (e == 6) {
    if (this->_item_focus == (Fl_Tree_Item *)0x0) {
      iVar4 = Fl::event_key();
      if (iVar4 == 0xff09) {
        iVar4 = 0xff54;
        if (bVar14) {
          iVar4 = 0xff52;
        }
        pFVar12 = next_visible_item(this,(Fl_Tree_Item *)0x0,iVar4);
        set_item_focus(this,pFVar12);
      }
      else if (iVar4 - 0xff51U < 2) {
        pFVar12 = next_visible_item(this,(Fl_Tree_Item *)0x0,0xff52);
        set_item_focus(this,pFVar12);
      }
      else {
        pFVar12 = next_visible_item(this,(Fl_Tree_Item *)0x0,0xff54);
        set_item_focus(this,pFVar12);
      }
    }
    uVar2 = Fl_Widget::visible_focus((Fl_Widget *)this);
    if (uVar2 != 0) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    return 1;
  }
  if (e == 7) {
    uVar2 = Fl_Widget::visible_focus((Fl_Widget *)this);
    if (uVar2 != 0) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    return 1;
  }
  if (((e != 8) || (pFVar10 = (Fl_Tree *)Fl::focus(), pFVar10 != this)) ||
     (FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs), (int)FVar9 < 1))
  goto switchD_0022a5dc_default;
  if (this->_item_focus == (Fl_Tree_Item *)0x0) {
    pFVar12 = first_visible_item(this);
    set_item_focus(this,pFVar12);
    iVar4 = Fl::event_key();
    if ((iVar4 == 0xff52) || (iVar4 = Fl::event_key(), iVar4 == 0xff54)) {
      return 1;
    }
  }
  if (this->_item_focus == (Fl_Tree_Item *)0x0) goto switchD_0022a5dc_default;
  iVar4 = Fl::event_key();
  if (iVar4 == 0x20) {
    FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs);
    __writefds = &switchD_0022a5dc::switchdataD_0028d720;
    switch(FVar9) {
    case FL_TREE_SELECT_NONE:
      break;
    case FL_TREE_SELECT_SINGLE:
    case FL_TREE_SELECT_SINGLE_DRAGGABLE:
      if (bVar15) {
        cVar1 = Fl_Tree_Item::is_selected(this->_item_focus);
        if (cVar1 == '\0') {
          pFVar12 = this->_item_focus;
          FVar3 = Fl_Widget::when((Fl_Widget *)this);
          select_only(this,pFVar12,FVar3);
        }
        else {
          FVar3 = Fl_Widget::when((Fl_Widget *)this);
          deselect_all(this,(Fl_Tree_Item *)0x0,FVar3);
        }
      }
      else {
        pFVar12 = this->_item_focus;
        FVar3 = Fl_Widget::when((Fl_Widget *)this);
        select_only(this,pFVar12,FVar3);
      }
      handle::_lastselect = this->_item_focus;
      return 1;
    case FL_TREE_SELECT_MULTI:
      if (bVar15) {
        pFVar12 = this->_item_focus;
        FVar3 = Fl_Widget::when((Fl_Widget *)this);
        select_toggle(this,pFVar12,FVar3);
      }
      else {
        pFVar12 = this->_item_focus;
        FVar3 = Fl_Widget::when((Fl_Widget *)this);
        select(this,(int)pFVar12,(fd_set *)(ulong)FVar3,(fd_set *)__writefds,in_R8,in_R9);
      }
      handle::_lastselect = this->_item_focus;
      return 1;
    }
    goto switchD_0022a5dc_default;
  }
  if ((iVar4 == 0x41) || (iVar4 == 0x61)) {
    if (((uVar2 & 0x40000) != 0) &&
       ((FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs), FL_TREE_SELECT_SINGLE < FVar9 &&
        (FVar9 == FL_TREE_SELECT_MULTI)))) {
      select_all(this,(Fl_Tree_Item *)0x0,1);
      handle::_lastselect = first_visible_item(this);
      Fl_Widget::take_focus((Fl_Widget *)this);
      return 1;
    }
    goto switchD_0022a5dc_default;
  }
  if (iVar4 == 0xff0d) {
LAB_0022a567:
    pFVar12 = this->_item_focus;
    FVar3 = Fl_Widget::when((Fl_Widget *)this);
    open_toggle(this,pFVar12,FVar3);
    return 1;
  }
  if (iVar4 == 0xff51) {
LAB_0022a72d:
    if (this->_item_focus != (Fl_Tree_Item *)0x0) {
      if ((iVar4 == 0xff53) && (iVar5 = Fl_Tree_Item::is_close(this->_item_focus), iVar5 != 0)) {
        open(this,(char *)this->_item_focus,1);
      }
      else if ((iVar4 == 0xff51) && (iVar4 = Fl_Tree_Item::is_open(this->_item_focus), iVar4 != 0))
      {
        close(this,(int)this->_item_focus);
      }
      return 1;
    }
  }
  else {
    if (iVar4 != 0xff52) {
      if (iVar4 == 0xff53) goto LAB_0022a72d;
      if (iVar4 != 0xff54) {
        if (iVar4 != 0xff8d) goto switchD_0022a5dc_default;
        goto LAB_0022a567;
      }
    }
    pFVar12 = next_visible_item(this,this->_item_focus,iVar4);
    set_item_focus(this,pFVar12);
    if (this->_item_focus != (Fl_Tree_Item *)0x0) {
      iVar4 = Fl_Tree_Item::y(this->_item_focus);
      iVar5 = Fl_Tree_Item::y(this->_item_focus);
      iVar6 = Fl_Tree_Item::h(this->_item_focus);
      iVar7 = Fl_Widget::y((Fl_Widget *)this);
      if (iVar4 < iVar7) {
        show_item_top(this,this->_item_focus);
      }
      iVar4 = Fl_Widget::y((Fl_Widget *)this);
      iVar7 = Fl_Widget::h((Fl_Widget *)this);
      __writefds_00 = (fd_set *)(ulong)(uint)(iVar4 + iVar7);
      if (iVar4 + iVar7 < iVar5 + iVar6) {
        show_item_bottom(this,this->_item_focus);
      }
      FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs);
      if (((FVar9 == FL_TREE_SELECT_MULTI) && (bVar14)) &&
         (cVar1 = Fl_Tree_Item::is_selected(this->_item_focus), cVar1 == '\0')) {
        pFVar12 = this->_item_focus;
        FVar3 = Fl_Widget::when((Fl_Widget *)this);
        select(this,(int)pFVar12,(fd_set *)(ulong)FVar3,__writefds_00,in_R8,in_R9);
        handle::_lastselect = this->_item_focus;
      }
      return 1;
    }
  }
switchD_0022a5dc_default:
  iVar4 = Fl_Group::handle(&this->super_Fl_Group,e);
  if (iVar4 != 0) {
    return 1;
  }
  if (this->_root != (Fl_Tree_Item *)0x0) {
    iVar4 = updown;
    if (e == 1) {
      handle::last_my = Fl::event_y();
      iVar5 = Fl::visible_focus();
      if ((iVar5 != 0) &&
         (iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6), iVar5 != 0))
      {
        Fl::focus((Fl_Widget *)this);
      }
      pFVar12 = Fl_Tree_Item::find_clicked(this->_root,&this->_prefs);
      if (pFVar12 == (Fl_Tree_Item *)0x0) {
        handle::_lastselect = (Fl_Tree_Item *)0x0;
        FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs);
        if ((FVar9 != FL_TREE_SELECT_NONE) && (FVar9 - FL_TREE_SELECT_SINGLE < 3)) {
          deselect_all(this,(Fl_Tree_Item *)0x0,1);
        }
      }
      else {
        set_item_focus(this,pFVar12);
        updown = 1;
        iVar5 = Fl::event_button();
        iVar4 = updown;
        if (iVar5 == 1) {
          iVar5 = Fl_Tree_Item::event_on_collapse_icon(pFVar12,&this->_prefs);
          if (iVar5 == 0) {
            iVar5 = Fl_Tree_Item::event_on_label(pFVar12,&this->_prefs);
            if (iVar5 != 0) {
              pFVar11 = Fl_Tree_Item::widget(pFVar12);
              if (pFVar11 != (Fl_Widget *)0x0) {
                pFVar11 = Fl_Tree_Item::widget(pFVar12);
                iVar5 = Fl::event_inside(pFVar11);
                if (iVar5 != 0) {
                  return 1;
                }
              }
              FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs);
              switch(FVar9) {
              case FL_TREE_SELECT_NONE:
                break;
              case FL_TREE_SELECT_SINGLE:
              case FL_TREE_SELECT_SINGLE_DRAGGABLE:
                FVar3 = Fl_Widget::when((Fl_Widget *)this);
                select_only(this,pFVar12,FVar3);
                handle::_lastselect = pFVar12;
                break;
              case FL_TREE_SELECT_MULTI:
                if (bVar14) {
                  if (handle::_lastselect == (Fl_Tree_Item *)0x0) {
                    select(this,(int)pFVar12,(fd_set *)&DAT_00000001,
                           (fd_set *)&switchD_0022ac07::switchdataD_0028d740,in_R8,in_R9);
                    handle::_lastselect = pFVar12;
                  }
                  else {
                    iVar5 = 1;
                    if (bVar15) {
                      iVar5 = 2;
                    }
                    extend_selection__(this,handle::_lastselect,pFVar12,iVar5,true);
                    handle::_lastselect = pFVar12;
                  }
                }
                else if (bVar15) {
                  FVar3 = Fl_Widget::when((Fl_Widget *)this);
                  select_toggle(this,pFVar12,FVar3);
                  handle::_lastselect = pFVar12;
                }
                else {
                  FVar3 = Fl_Widget::when((Fl_Widget *)this);
                  select_only(this,pFVar12,FVar3);
                  handle::_lastselect = pFVar12;
                }
              }
            }
          }
          else {
            open_toggle(this,pFVar12,1);
          }
        }
      }
    }
    else if (e == 2) {
      FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs);
      if ((FVar9 == FL_TREE_SELECT_SINGLE_DRAGGABLE) && (iVar4 = Fl::event_button(), iVar4 == 1)) {
        pFVar12 = Fl_Tree_Item::find_clicked(this->_root,&this->_prefs);
        if ((pFVar12 != (Fl_Tree_Item *)0x0) &&
           ((handle::_lastselect != (Fl_Tree_Item *)0x0 && (pFVar12 != handle::_lastselect)))) {
          iVar4 = Fl::event_x();
          iVar5 = Fl_Tree_Item::label_x(pFVar12);
          if (iVar5 <= iVar4) {
            iVar4 = Fl::event_y();
            iVar5 = Fl_Tree_Item::y(pFVar12);
            iVar6 = Fl_Tree_Item::h(pFVar12);
            bVar14 = iVar6 / 2 <= iVar4 - iVar5;
            if ((((!bVar14) && (pFVar13 = prev(this,pFVar12), pFVar13 != handle::_lastselect)) ||
                ((bVar14 && (pFVar13 = next(this,pFVar12), pFVar13 != handle::_lastselect)))) &&
               (pFStack_98 = Fl_Tree_Item::parent(pFVar12), pFStack_98 != (Fl_Tree_Item *)0x0)) {
              local_9c = Fl_Tree_Item::find_child(pFStack_98,pFVar12);
              if (bVar14) {
                local_9c = local_9c + 1;
              }
              iVar4 = Fl_Tree_Item::children(pFVar12);
              if (((iVar4 != 0) && (iVar4 = Fl_Tree_Item::is_open(pFVar12), iVar4 != 0)) && (bVar14)
                 ) {
                local_9c = 0;
                pFStack_98 = pFVar12;
              }
              pFVar13 = Fl_Tree_Item::parent(handle::_lastselect);
              if (pFVar13 == pFStack_98) {
                if (bVar14) {
                  Fl_Tree_Item::move_below(handle::_lastselect,pFVar12);
                }
                else {
                  Fl_Tree_Item::move_above(handle::_lastselect,pFVar12);
                }
              }
              else {
                Fl_Tree_Item::move_into(handle::_lastselect,pFStack_98,local_9c);
              }
              Fl_Widget::redraw((Fl_Widget *)this);
              do_callback_for_item(this,handle::_lastselect,FL_TREE_REASON_DRAGGED);
            }
          }
        }
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      updown = 1;
      iVar4 = updown;
    }
    else if (e == 5) {
      iVar5 = Fl::event_y();
      p_1 = 0xff52;
      if (handle::last_my < iVar5) {
        p_1 = 0xff54;
      }
      handle::last_my = iVar5;
      iVar6 = Fl_Widget::y((Fl_Widget *)this);
      if (iVar5 < iVar6) {
        p_1 = 0xff52;
        iVar6 = vposition(this);
        iVar7 = Fl_Widget::y((Fl_Widget *)this);
        item_1._4_4_ = iVar6 - (iVar7 - iVar5);
        if (item_1._4_4_ < 0) {
          item_1._4_4_ = 0;
        }
        vposition(this,item_1._4_4_);
      }
      else {
        iVar6 = Fl_Widget::y((Fl_Widget *)this);
        iVar7 = Fl_Widget::h((Fl_Widget *)this);
        if (iVar6 + iVar7 < iVar5) {
          p_1 = 0xff54;
          iVar6 = vposition(this);
          iVar7 = Fl_Widget::y((Fl_Widget *)this);
          iVar8 = Fl_Widget::h((Fl_Widget *)this);
          item_1._0_4_ = iVar6 + ((iVar5 - iVar7) - iVar8);
          dVar16 = Fl_Valuator::maximum((Fl_Valuator *)this->_vscroll);
          if ((int)dVar16 < (int)item_1) {
            dVar16 = Fl_Valuator::maximum((Fl_Valuator *)this->_vscroll);
            item_1._0_4_ = (int)dVar16;
          }
          vposition(this,(int)item_1);
        }
      }
      iVar5 = Fl::event_button();
      if ((iVar5 == 1) &&
         (from = Fl_Tree_Item::find_clicked(this->_root,&this->_prefs), from != (Fl_Tree_Item *)0x0)
         ) {
        updown = 1;
        FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs);
        if (FVar9 != FL_TREE_SELECT_SINGLE_DRAGGABLE) {
          set_item_focus(this,from);
        }
        iVar4 = 1;
        if (from != handle::_lastselect) {
          FVar9 = Fl_Tree_Prefs::selectmode(&this->_prefs);
          switch(FVar9) {
          case FL_TREE_SELECT_NONE:
            break;
          case FL_TREE_SELECT_SINGLE:
            FVar3 = Fl_Widget::when((Fl_Widget *)this);
            select_only(this,from,FVar3);
            break;
          case FL_TREE_SELECT_MULTI:
            pFVar12 = next_visible_item(this,handle::_lastselect,p_1);
            iVar4 = 1;
            if (bVar15) {
              iVar4 = 2;
            }
            extend_selection_dir(this,pFVar12,from,p_1,iVar4,true);
            break;
          case FL_TREE_SELECT_SINGLE_DRAGGABLE:
            from = handle::_lastselect;
            Fl_Widget::redraw((Fl_Widget *)this);
          }
          handle::_lastselect = from;
          iVar4 = updown;
        }
      }
    }
    updown = iVar4;
    return updown;
  }
  return 0;
}

Assistant:

int Fl_Tree::handle(int e) {
  if (e == FL_NO_EVENT) return(0);		// XXX: optimize to prevent slow resizes on large trees!
  int ret = 0;
  char is_shift   = Fl::event_state() & FL_SHIFT   ? 1 : 0;
  char is_ctrl    = Fl::event_state() & FL_CTRL    ? 1 : 0;
  char is_command = Fl::event_state() & FL_COMMAND ? 1 : 0;	// ctrl on win/lin, 'Command' on mac
#if FLTK_ABI_VERSION >= 10301
  // NEW: data inside Fl_Tree
#else /*FLTK_ABI_VERSION*/
  // OLD:
  static Fl_Tree_Item *_lastselect = 0;		// used to extend selections
#endif /*FLTK_ABI_VERSION*/
  // Developer note: Fl_Browser_::handle() used for reference here..
  // #include <FL/names.h>	// for event debugging
  // fprintf(stderr, "DEBUG: %s (%d)\n", fl_eventnames[e], e);

  if (e == FL_ENTER || e == FL_LEAVE) return(1);
  switch (e) {
    case FL_FOCUS: {
      // FLTK tests if we want focus. 
      //     If a nav key was used to give us focus, and we've got no saved
      //     focus widget, determine which item gets focus depending on nav key.
      //
      if ( ! _item_focus ) {				// no focus established yet?
	switch (Fl::event_key()) {			// determine if focus was navigated..
	  case FL_Tab: {				// received focus via TAB?
	    int updown = is_shift ? FL_Up : FL_Down;	// SHIFT-TAB similar to Up, TAB similar to Down
	    set_item_focus(next_visible_item(0, updown));
	    break;
	  }
	  case FL_Left:		// received focus via LEFT or UP?
	  case FL_Up: { 	// XK_ISO_Left_Tab
	    set_item_focus(next_visible_item(0, FL_Up));
	    break;
	  }
	  case FL_Right: 	// received focus via RIGHT or DOWN?
	  case FL_Down:
	  default: {
	    set_item_focus(next_visible_item(0, FL_Down));
	    break;
	  }
	}
      }
      if ( visible_focus() ) redraw();	// draw focus change
      return(1);
    }
    case FL_UNFOCUS: {		// FLTK telling us some other widget took focus.
      if ( visible_focus() ) redraw();	// draw focus change
      return(1);
    }
    case FL_KEYBOARD: {		// keyboard shortcut
      // Do shortcuts first or scrollbar will get them...
      if ( (Fl::focus() == this) &&				// tree has focus?
           _prefs.selectmode() > FL_TREE_SELECT_NONE ) {	// select mode that supports kb events?
	if ( !_item_focus ) {					// no current focus item?
	  set_item_focus(first_visible_item());			// use first vis item
	  if ( Fl::event_key() == FL_Up ||			// Up or down?
	       Fl::event_key() == FL_Down )			// ..if so, already did 'motion'
	    return(1);						// ..so just return.
	}
	if ( _item_focus ) {
	  int ekey = Fl::event_key();
	  switch (ekey) {
	    case FL_Enter:	// ENTER: toggle open/close
	    case FL_KP_Enter: {
	      open_toggle(_item_focus, when());			// toggle item in focus
	      return(1);					// done, we handled key
	    }
	    case ' ':		// SPACE: change selection state
	      switch ( _prefs.selectmode() ) {
		case FL_TREE_SELECT_NONE:
		  break;					// ignore, let group have shot at event
		case FL_TREE_SELECT_SINGLE:
		case FL_TREE_SELECT_SINGLE_DRAGGABLE:
		  if ( is_ctrl ) {				// CTRL-SPACE: (single mode) toggle
		    if ( ! _item_focus->is_selected() ) {
		      select_only(_item_focus, when());
		    } else {
		      deselect_all(0, when());
		    }
		  } else {
		    select_only(_item_focus, when());		// SPACE: (single mode) select only
		  }
		  _lastselect = _item_focus;
	          return(1);					// done, we handled key
		case FL_TREE_SELECT_MULTI:
		  if ( is_ctrl ) {
		    select_toggle(_item_focus, when());		// CTRL-SPACE: (multi mode) toggle selection
		  } else {
		    select(_item_focus, when());		// SPACE: (multi-mode) select
		  }
		  _lastselect = _item_focus;
	          return(1);					// done, we handled key
	      }
	      break;
	    case FL_Right:  	// RIGHT: open children (if any)
	    case FL_Left: {	// LEFT: close children (if any)
	      if ( _item_focus ) {
		if ( ekey == FL_Right && _item_focus->is_close() ) {
		  open(_item_focus);	// open closed item
		  ret = 1;
		} else if ( ekey == FL_Left && _item_focus->is_open() ) {
		  close(_item_focus);	// close open item
		  ret = 1;
		}
		return(1);
	      }
	      break;
	    }
	    case FL_Up:		// UP: next item up, or extend selection up
	    case FL_Down: {	// DOWN: next item down, or extend selection down
	      set_item_focus(next_visible_item(_item_focus, ekey));	// next item up|dn
	      if ( _item_focus ) {					// item in focus?
	        // Autoscroll
		int itemtop = _item_focus->y();
		int itembot = _item_focus->y()+_item_focus->h();
		if ( itemtop < y() ) { show_item_top(_item_focus); }
		if ( itembot > y()+h() ) { show_item_bottom(_item_focus); }
		// Extend selection
		if ( _prefs.selectmode() == FL_TREE_SELECT_MULTI &&	// multiselect on?
		     is_shift &&					// shift key?
		     ! _item_focus->is_selected() ) {			// not already selected?
		  select(_item_focus, when());				// extend selection..
		  _lastselect = _item_focus;
		}
		return(1);
	      }
	      break;
	    }
	    case 'a':
	    case 'A': {
	      if ( is_command ) {					// ^A (win/linux), Meta-A (mac)
		switch ( _prefs.selectmode() ) {
		  case FL_TREE_SELECT_NONE:
		  case FL_TREE_SELECT_SINGLE:
		  case FL_TREE_SELECT_SINGLE_DRAGGABLE:
		    break;
		  case FL_TREE_SELECT_MULTI:
		    // Do a 'select all'
	            select_all();
		    _lastselect = first_visible_item();
		    take_focus();
		    return(1);
		}
	      }
	      break;
	    }
	  }
	}
      }
      break;
    }
  }

  // Let Fl_Group take a shot at handling the event
  if (Fl_Group::handle(e)) {
    return(1);			// handled? don't continue below
  }

  // Handle events the child FLTK widgets didn't need

  // fprintf(stderr, "Fl_Tree::handle(): Event was %s (%d)\n", fl_eventnames[e], e); // DEBUGGING
  if ( ! _root ) return(ret);
  static int last_my = 0;
  switch ( e ) {
    case FL_PUSH: {		// clicked on tree
      last_my = Fl::event_y();	// save for dragging direction..
      if (Fl::visible_focus() && handle(FL_FOCUS)) Fl::focus(this);
#if FLTK_ABI_VERSION >= 10303
      Fl_Tree_Item *item = _root->find_clicked(_prefs, 0);
#else
      Fl_Tree_Item *item = _root->find_clicked(_prefs);
#endif
      if ( !item ) {		// clicked, but not on an item?
        _lastselect = 0;
	switch ( _prefs.selectmode() ) {
	  case FL_TREE_SELECT_NONE:
	    break;
	  case FL_TREE_SELECT_SINGLE:
	  case FL_TREE_SELECT_SINGLE_DRAGGABLE:
	  case FL_TREE_SELECT_MULTI:
	    deselect_all();
	    break;
	}
	break;
      }
      set_item_focus(item);			// becomes new focus widget, calls redraw() if needed
      ret |= 1;					// handled
      if ( Fl::event_button() == FL_LEFT_MOUSE ) {
	if ( item->event_on_collapse_icon(_prefs) ) {	// collapse icon clicked?
	  open_toggle(item);				// toggle open (handles redraw)
	} else if ( item->event_on_label(_prefs) && 	// label clicked?
		 (!item->widget() || !Fl::event_inside(item->widget())) ) {	// not inside widget
	  switch ( _prefs.selectmode() ) {
	    case FL_TREE_SELECT_NONE:
	      break;
	    case FL_TREE_SELECT_SINGLE:
	    case FL_TREE_SELECT_SINGLE_DRAGGABLE:
	      select_only(item, when());		// select only this item (handles redraw)
	      _lastselect = item;
	      break;
	    case FL_TREE_SELECT_MULTI: {
	      if ( is_shift ) {			// SHIFT+PUSH?
	        if ( _lastselect ) {
		  int val = is_ctrl ? 2 : 1;
		  bool visible = true;
#if FLTK_ABI_VERSION >= 10303
	          extend_selection(_lastselect, item, val, visible);
#else
	          extend_selection__(_lastselect, item, val, visible);
#endif
	        } else {
	          select(item);			// add to selection
		}
	      } else if ( is_ctrl ) {		// CTRL+PUSH?
		select_toggle(item, when());	// toggle selection state
	      } else {
		select_only(item, when());
	      }
	      _lastselect = item;
	      break;
	    }
	  }
	}
      }
      break;
    }
    case FL_DRAG: {
      // Do scrolling first..

      // Detect up/down dragging
      int my = Fl::event_y();
      int dir = (my>last_my) ? FL_Down : FL_Up;
      last_my = my;

      // Handle autoscrolling
      if ( my < y() ) {				// Above top?
        dir = FL_Up;				// ..going up
        int p = vposition()-(y()-my);		// ..position above us
	if ( p < 0 ) p = 0;			// ..don't go above 0
        vposition(p);				// ..scroll to new position
      } else if ( my > (y()+h()) ) {		// Below bottom?
        dir = FL_Down;				// ..going down
        int p = vposition()+(my-y()-h());	// ..position below us
	if ( p > (int)_vscroll->maximum() )	// ..don't go below bottom
	  p = (int)_vscroll->maximum();
        vposition(p);				// ..scroll to new position
      }

      // Now handle the event..
      //    During drag, only interested in left-mouse operations.
      //
      if ( Fl::event_button() != FL_LEFT_MOUSE ) break;
#if FLTK_ABI_VERSION >= 10303
      Fl_Tree_Item *item = _root->find_clicked(_prefs, 1); // item we're on, vertically
#else
      Fl_Tree_Item *item = _root->find_clicked(_prefs); // item we're on, vertically
#endif
      if ( !item ) break;			// not near item? ignore drag event
      ret |= 1;					// acknowledge event
      if (_prefs.selectmode() != FL_TREE_SELECT_SINGLE_DRAGGABLE)
        set_item_focus(item);			// becomes new focus item
      if (item==_lastselect) break;		// same item as before? avoid reselect

      // Handle selection behavior
      switch ( _prefs.selectmode() ) {
	case FL_TREE_SELECT_NONE:
	  break;				// no selection changes
	case FL_TREE_SELECT_SINGLE: {
	  select_only(item, when());		// select only this item (handles redraw)
	  break;
	}
	case FL_TREE_SELECT_SINGLE_DRAGGABLE: {
	  item = _lastselect; // Keep the source intact
	  redraw();
	  break;
	}
	case FL_TREE_SELECT_MULTI: {
	  Fl_Tree_Item *from = next_visible_item(_lastselect, dir); // avoid reselecting item
	  Fl_Tree_Item *to = item;
	  int val = is_ctrl ? 2 : 1;	// toggle_select() or just select()?
	  bool visible = true;
	  extend_selection_dir(from, to, dir, val, visible);
	  break;
	}
      }
      _lastselect = item;			// save current item for later
      break;
    }
    case FL_RELEASE:
      if (_prefs.selectmode() == FL_TREE_SELECT_SINGLE_DRAGGABLE &&
          Fl::event_button() == FL_LEFT_MOUSE) {
#if FLTK_ABI_VERSION >= 10303
        Fl_Tree_Item *item = _root->find_clicked(_prefs, 1); // item we're on, vertically
#else
        Fl_Tree_Item *item = _root->find_clicked(_prefs); // item we're on, vertically
#endif

        if (item && _lastselect && item != _lastselect &&
            Fl::event_x() >= item->label_x()) {
          //printf("Would drag '%s' to '%s'\n", _lastselect->label(), item->label());
          // Are we dropping above or below the target item?
          const int h = Fl::event_y() - item->y();
          const int mid = item->h() / 2;
          const bool before = h < mid;
          //printf("Dropping %s it\n", before ? "before" : "after");

          // Do nothing if it would be a no-op
          if ((before && prev(item) != _lastselect) ||
              (!before && next(item) != _lastselect)) {
            Fl_Tree_Item *parent = item->parent();

            if (parent) {
              int pos = parent->find_child(item);
              if (!before)
                pos++;

              // Special case: trying to drop right before a folder
              if (item->children() && item->is_open() && !before) {
                parent = item;
                pos = 0;
              }

              // If we're moving inside the same parent, use the below/above methods
              if (_lastselect->parent() == parent) {
                if (before) {
                  _lastselect->move_above(item);
                } else {
                  _lastselect->move_below(item);
                }
              } else {
                _lastselect->move_into(parent, pos);
              }

              redraw();
              do_callback_for_item(_lastselect, FL_TREE_REASON_DRAGGED);
            }
          }
        }
        redraw();
      } // End single-drag check
      ret |= 1;
      break;
  }
  return(ret);
}